

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdma.cc
# Opt level: O3

void __thiscall
bsplib::Rdma::hpget(Rdma *this,int src_pid,Memslot src_slot,size_t src_offset,void *dst,size_t size)

{
  pointer *pppvVar1;
  iterator __position;
  pointer ppvVar2;
  ssize_t sVar3;
  int __flags;
  void *pvVar4;
  Action action;
  void *local_98;
  Memslot local_90;
  TicToc local_88;
  Action local_68;
  
  pvVar4 = dst;
  local_98 = dst;
  local_88.m_record = TicToc::push(HPGET);
  __flags = (int)pvVar4;
  clock_gettime(1,(timespec *)&local_68);
  local_88.m_nbytes = 0;
  if (size < this->m_min_n_hp_msg_size) {
    get(this,src_pid,src_slot,src_offset,dst,size);
  }
  else {
    local_90 = src_slot;
    if (((this->m_used_slots).
         super__Vector_base<bsplib::Rdma::Memblock,_std::allocator<bsplib::Rdma::Memblock>_>._M_impl
         .super__Vector_impl_data._M_start[(long)this->m_nprocs * src_slot + (long)this->m_pid].
         status & 1) != 0) {
      __assert_fail("!( slot( m_pid, src_slot ).status & Memblock::PUSHED)",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/wijnand-suijlen[P]bsponmpi/src/rdma.cc"
                    ,0x8f,"void bsplib::Rdma::hpget(int, Memslot, size_t, void *, size_t)");
    }
    __position._M_current =
         (this->m_local_slots).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
         super__Vector_impl_data._M_finish;
    ppvVar2 = (this->m_local_slots).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if (__position._M_current ==
        (this->m_local_slots).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<void*,std::allocator<void*>>::_M_realloc_insert<void*const&>
                ((vector<void*,std::allocator<void*>> *)&this->m_local_slots,__position,&local_98);
      dst = local_98;
    }
    else {
      *__position._M_current = dst;
      pppvVar1 = &(this->m_local_slots).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      *pppvVar1 = *pppvVar1 + 1;
    }
    sVar3 = Unbuf::recv(&this->m_unbuf,src_pid,dst,size,__flags);
    local_68.dst_slot = (long)__position._M_current - (long)ppvVar2 >> 3;
    local_68.kind = HPGET;
    local_68.dst_pid = this->m_pid;
    local_68.tag = (int)sVar3;
    local_68.src_slot = local_90;
    local_68.target_pid = src_pid;
    local_68.src_pid = src_pid;
    local_68.offset = src_offset;
    local_68.size = size;
    ActionBuf::push_back(&this->m_send_actions,&local_68);
  }
  TicToc::~TicToc(&local_88);
  return;
}

Assistant:

void Rdma::hpget( int src_pid, Memslot src_slot, size_t src_offset,
        void * dst, size_t size )
{
#ifdef PROFILE
    TicToc t( TicToc::HPGET );
#endif
    if ( size < m_min_n_hp_msg_size ) { 
        get( src_pid, src_slot, src_offset, dst, size );
        return;
    }

    assert( !( slot( m_pid, src_slot ).status & Memblock::PUSHED) );
    
    Memslot dst_slot = m_local_slots.size();
    m_local_slots.push_back( dst );

    int tag = m_unbuf.recv( src_pid, dst, size );
    Action action = { Action::HPGET, src_pid, src_pid, m_pid, 
                      tag, src_slot, dst_slot, src_offset, size };
    m_send_actions.push_back( action );

}